

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_2,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,2>
          (Matrix<float,_2,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_2> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  int r;
  long lVar2;
  float *pfVar3;
  Matrix<float,_3,_2> *extraout_RDX;
  Matrix<float,_3,_2> *mat;
  long lVar4;
  Matrix<float,_3,_2> *pMVar5;
  Matrix<float,_3,_2> retVal;
  Matrix<float,_3,_2> local_38;
  
  pMVar5 = &local_38;
  tcu::Matrix<float,_3,_2>::Matrix(&local_38);
  mat = extraout_RDX;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar1 = a->m_data[lVar2];
    pfVar3 = (float *)pMVar5;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      *pfVar3 = *(float *)(this + lVar4 * 4) * fVar1;
      pfVar3 = pfVar3 + 3;
    }
    pMVar5 = (Matrix<float,_3,_2> *)((long)pMVar5 + 4);
    mat = (Matrix<float,_3,_2> *)0x2;
  }
  tcu::transpose<float,3,2>(__return_storage_ptr__,(tcu *)&local_38,mat);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}